

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void __thiscall duckdb::StringValueResult::~StringValueResult(StringValueResult *this)

{
  pointer pcVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Head_base<0UL,_duckdb::ParseTypeInfo_*,_false> _Var3;
  _Head_base<0UL,_unsigned_long_*,_false> _Var4;
  _Head_base<0UL,_const_char_**,_false> _Var5;
  pointer ppVVar6;
  pointer ppvVar7;
  
  CSVErrorHandler::Insert
            (this->error_handler,(this->iterator->boundary).boundary_idx,*this->lines_read);
  if (this->iterator->done == false) {
    CSVErrorHandler::DontPrintErrorLine(this->error_handler);
  }
  pcVar1 = (this->path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->path).field_2) {
    operator_delete(pcVar1);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->borked_rows)._M_h);
  StrTimeFormat::~StrTimeFormat(&(this->timestamp_format).super_StrTimeFormat);
  StrTimeFormat::~StrTimeFormat(&(this->date_format).super_StrTimeFormat);
  ::std::vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_>::~vector
            ((vector<duckdb::CurrentError,_std::allocator<duckdb::CurrentError>_> *)
             &this->current_errors);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->buffer_handles)._M_h);
  _Var2._M_head_impl =
       (this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (bool *)0x0) {
    operator_delete__(_Var2._M_head_impl);
  }
  (this->projected_columns).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  this_00 = (this->csv_file_scan).internal.
            super___shared_ptr<duckdb::CSVFileScan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->names);
  _Var3._M_head_impl =
       (this->parse_types).
       super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t
       .super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>
       .super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (ParseTypeInfo *)0x0) {
    operator_delete__(_Var3._M_head_impl);
  }
  (this->parse_types).
  super_unique_ptr<duckdb::ParseTypeInfo[],_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParseTypeInfo,_std::default_delete<duckdb::ParseTypeInfo[]>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ParseTypeInfo_*,_std::default_delete<duckdb::ParseTypeInfo[]>_>.
  super__Head_base<0UL,_duckdb::ParseTypeInfo_*,_false>._M_head_impl = (ParseTypeInfo *)0x0;
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::FullLinePosition>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->line_positions_per_row)._M_h);
  DataChunk::~DataChunk(&this->parse_chunk);
  _Var4._M_head_impl =
       (this->null_str_size).
       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  if (_Var4._M_head_impl != (unsigned_long *)0x0) {
    operator_delete__(_Var4._M_head_impl);
  }
  (this->null_str_size).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
  _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = (unsigned_long *)0x0;
  _Var5._M_head_impl =
       (this->null_str_ptr).super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>.
       _M_t.super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
       super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
       super__Head_base<0UL,_const_char_**,_false>._M_head_impl;
  if (_Var5._M_head_impl != (char **)0x0) {
    operator_delete__(_Var5._M_head_impl);
  }
  (this->null_str_ptr).super_unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>._M_t.
  super___uniq_ptr_impl<const_char_*,_std::default_delete<const_char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_char_**,_std::default_delete<const_char_*[]>_>.
  super__Head_base<0UL,_const_char_**,_false>._M_head_impl = (char **)0x0;
  ppVVar6 = (this->validity_mask).
            super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
            super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppVVar6 != (pointer)0x0) {
    operator_delete(ppVVar6);
  }
  ppvVar7 = (this->vector_ptr).super_vector<void_*,_std::allocator<void_*>_>.
            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (ppvVar7 != (pointer)0x0) {
    operator_delete(ppvVar7);
    return;
  }
  return;
}

Assistant:

StringValueResult::~StringValueResult() {
	// We have to insert the lines read by this scanner
	error_handler.Insert(iterator.GetBoundaryIdx(), lines_read);
	if (!iterator.done) {
		// Some operators, like Limit, might cause a future error to incorrectly report the wrong error line
		// Better to print nothing to print something wrong
		error_handler.DontPrintErrorLine();
	}
}